

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *this,PropertyRecord **key)

{
  int *piVar1;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>_>
  *pSVar2;
  PropertyRecord *pPVar3;
  uint uVar4;
  uint uVar5;
  PropertyRecord *local_40;
  BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_38;
  
  piVar1 = (this->buckets).ptr;
  uVar4 = 0;
  local_38 = this;
  if (piVar1 != (int *)0x0) {
    uVar4 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    uVar5 = piVar1[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar5) {
      pSVar2 = (local_38->entries).ptr;
      uVar4 = 0;
      do {
        pPVar3 = pSVar2[uVar5].
                 super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                 .
                 super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>_>
                 .
                 super_ValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>_>
                 .super_ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>.value.ptr;
        Memory::Recycler::WBSetBit((char *)&local_40);
        local_40 = pPVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
        if (local_40 == *key) {
          if (local_38->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(local_38->stats,uVar4);
          }
          goto LAB_008e80ea;
        }
        uVar4 = uVar4 + 1;
        uVar5 = pSVar2[uVar5].
                super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .
                super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>_>
                .
                super_ValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>_>
                .super_ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>.next;
      } while (-1 < (int)uVar5);
    }
  }
  uVar5 = 0xffffffff;
  if (local_38->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_38->stats,uVar4);
  }
LAB_008e80ea:
  return -1 < (int)uVar5;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }